

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chared.c
# Opt level: O0

wchar_t el_winsertstr(EditLine *el,wchar_t *s)

{
  wchar_t *pwVar1;
  wchar_t wVar2;
  size_t addlen;
  size_t len;
  wchar_t *s_local;
  EditLine *el_local;
  
  if ((s == (wchar_t *)0x0) || (addlen = wcslen(s), addlen == 0)) {
    el_local._4_4_ = L'\xffffffff';
  }
  else if (((el->el_line).lastchar + addlen < (el->el_line).limit) ||
          (wVar2 = ch_enlargebufs(el,addlen), wVar2 != L'\0')) {
    c_insert(el,(wchar_t)addlen);
    len = (size_t)s;
    while (*(int *)len != 0) {
      wVar2 = *(wchar_t *)len;
      pwVar1 = (el->el_line).cursor;
      (el->el_line).cursor = pwVar1 + 1;
      *pwVar1 = wVar2;
      len = len + 4;
    }
    el_local._4_4_ = L'\0';
  }
  else {
    el_local._4_4_ = L'\xffffffff';
  }
  return el_local._4_4_;
}

Assistant:

int
el_winsertstr(EditLine *el, const wchar_t *s)
{
	size_t len;

	if (s == NULL || (len = wcslen(s)) == 0)
		return -1;
	if (el->el_line.lastchar + len >= el->el_line.limit) {
		if (!ch_enlargebufs(el, len))
			return -1;
	}

	c_insert(el, (int)len);
	while (*s)
		*el->el_line.cursor++ = *s++;
	return 0;
}